

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O2

void __thiscall LLVMBC::MDString::MDString(MDString *this,Module *module,String *str_)

{
  (this->super_MDOperand).parent = module;
  (this->super_MDOperand).kind = String;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(&this->str,str_);
  return;
}

Assistant:

MDOperand::MDOperand(Module *parent_, MetadataKind kind_)
    : parent(parent_)
    , kind(kind_)
{
}